

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  CX3DImporter_NodeElement_IndexedSet *this_00;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  byte local_a9;
  CX3DImporter_NodeElement_IndexedSet *pCStack_a8;
  bool close_found;
  CX3DImporter_NodeElement_Set *ne_alias;
  undefined1 local_98 [8];
  string an;
  uint local_64;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  string local_50 [4];
  bool solid;
  bool normalPerVertex;
  bool colorPerVertex;
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  ne._7_1_ = 1;
  ne._6_1_ = 1;
  ne._5_1_ = 1;
  ne._4_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_IndexedSet *)0x0;
  local_64 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_64 < iVar2; local_64 = local_64 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_64);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_98,(char *)CONCAT44(extraout_var,iVar3),
               (allocator *)((long)&ne_alias + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&ne_alias + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_64);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
      ne_alias._0_4_ = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_64);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        ne_alias._0_4_ = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_98,"bboxCenter");
        if (bVar1) {
          ne_alias._0_4_ = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_98,"bboxSize");
          if (bVar1) {
            ne_alias._0_4_ = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_98,"containerField");
            if (bVar1) {
              ne_alias._0_4_ = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_98,"ccw");
              if (bVar1) {
                ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_64);
                ne_alias._0_4_ = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_98,"colorPerVertex");
                if (bVar1) {
                  ne._6_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_64);
                  ne_alias._0_4_ = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_98,"normalPerVertex");
                  if (bVar1) {
                    ne._5_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_64);
                    ne_alias._0_4_ = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_98,"solid");
                    if (bVar1) {
                      ne._4_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_64);
                      ne_alias._0_4_ = 4;
                    }
                    else {
                      Throw_IncorrectAttr(this,(string *)local_98);
                      ne_alias._0_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_TriangleSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    this_00 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (this_00,ENET_TriangleSet,this->NodeElement_Cur);
    _idx_end = this_00;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,local_50);
    }
    pCStack_a8 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 = ne._7_1_ & 1;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x72 = ne._6_1_ & 1;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x73 = ne._5_1_ & 1;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).Solid = (bool)(ne._4_1_ & 1);
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_a9 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00bc672b;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_d0,"Color",&local_d1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_d1);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_f8,"ColorRGBA",&local_f9);
              bVar1 = XML_CheckNode_NameEqual(this,&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_f9);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_120,"Coordinate",&local_121);
                bVar1 = XML_CheckNode_NameEqual(this,&local_120);
                std::__cxx11::string::~string((string *)&local_120);
                std::allocator<char>::~allocator((allocator<char> *)&local_121);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_148,"Normal",&local_149);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_148);
                  std::__cxx11::string::~string((string *)&local_148);
                  std::allocator<char>::~allocator((allocator<char> *)&local_149);
                  if (bVar1) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_170,"TextureCoordinate",&local_171);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_170);
                    std::__cxx11::string::~string((string *)&local_170);
                    std::allocator<char>::~allocator((allocator<char> *)&local_171);
                    if (bVar1) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string((string *)&local_198,"TriangleSet",&local_199);
                        XML_CheckNode_SkipUnsupported(this,&local_198);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::allocator<char>::~allocator((allocator<char> *)&local_199);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"TriangleSet",&local_1c1);
        bVar1 = XML_CheckNode_NameEqual(this,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      } while (!bVar1);
      local_a9 = 1;
LAB_00bc672b:
      if ((local_a9 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1e8,"TriangleSet",&local_1e9);
        Throw_CloseNotFound(this,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleSet, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_TriangleSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleSet");

			MACRO_NODECHECK_LOOPEND("TriangleSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}